

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O3

void __thiscall ProblemTest_ReadNL_Test::TestBody(ProblemTest_ReadNL_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int in_R9D;
  Problem p;
  AssertHelper AStack_388;
  NLFileReader<fmt::File> local_380;
  BasicProblem<mp::BasicProblemParams<int>_> local_368;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&local_368);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_380.file_.fd_ = -1;
    local_380.size_ = 0;
    local_380.rounded_size_ = 0;
    mp::internal::NLFileReader<fmt::File>::Read<mp::BasicProblem<mp::BasicProblemParams<int>>>
              (&local_380,(CStringRef)0x16f9cb,&local_368,0);
    fmt::File::~File(&local_380.file_);
  }
  testing::Message::Message((Message *)&local_380);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_388,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",0x25
             ,
             "Expected: ReadNLFile(\"nonexistent\", p) throws an exception of type fmt::SystemError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_388,(Message *)&local_380);
  testing::internal::AssertHelper::~AssertHelper(&AStack_388);
  if (CONCAT44(local_380._4_4_,local_380.file_.fd_) != 0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && ((long *)CONCAT44(local_380._4_4_,local_380.file_.fd_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_380._4_4_,local_380.file_.fd_) + 8))();
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = &local_368;
    mp::ReadNLString<mp::BasicProblem<mp::BasicProblemParams<int>>>
              ((mp *)0x1755e0,(NLStringRef)(auVar1 << 0x40),
               (BasicProblem<mp::BasicProblemParams<int>_> *)"(input)",(CStringRef)0x0,in_R9D);
  }
  testing::Message::Message((Message *)&local_380);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_388,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",0x26
             ,
             "Expected: ReadNLString(\"\", p) throws an exception of type mp::Error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_388,(Message *)&local_380);
  testing::internal::AssertHelper::~AssertHelper(&AStack_388);
  if (CONCAT44(local_380._4_4_,local_380.file_.fd_) != 0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && ((long *)CONCAT44(local_380._4_4_,local_380.file_.fd_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_380._4_4_,local_380.file_.fd_) + 8))();
    }
  }
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&local_368);
  return;
}

Assistant:

TEST(ProblemTest, ReadNL) {
  mp::Problem p;
  // Just make sure that ReadNLFile and ReadNLString are accessible.
  // They are tested elsewhere.
  EXPECT_THROW(ReadNLFile("nonexistent", p), fmt::SystemError);
  EXPECT_THROW(ReadNLString("", p), mp::Error);
}